

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O1

bool __thiscall adios2::kvcache::QueryBox::operator==(QueryBox *this,QueryBox *box)

{
  _Alloc_hider __s1;
  int iVar1;
  string local_58;
  string local_38;
  
  toString_abi_cxx11_(&local_58,this);
  __s1._M_p = local_58._M_dataplus._M_p;
  toString_abi_cxx11_(&local_38,box);
  iVar1 = strcmp(__s1._M_p,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar1 == 0;
}

Assistant:

bool operator==(const QueryBox &box) const
    {
        return std::strcmp(toString().c_str(), box.toString().c_str()) == 0;
    }